

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall Player::ChangePass(Player *this,secure_string *password)

{
  World *pWVar1;
  mapped_type *this_00;
  string *str;
  undefined8 uVar2;
  undefined8 uVar3;
  Database_Result local_110;
  string local_f0;
  allocator local_b9;
  key_type local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  string local_58;
  undefined1 local_38 [8];
  secure_string password_buffer;
  secure_string *password_local;
  Player *this_local;
  
  pWVar1 = this->world;
  password_buffer.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code = (size_t)password;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"PasswordSalt",&local_b9);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_b8);
  util::variant::operator_cast_to_string(&local_98,this_00);
  std::operator+(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_98);
  util::secure_string::str_abi_cxx11_
            ((secure_string *)
             password_buffer.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                 local_78);
  util::secure_string::secure_string((secure_string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  str = util::secure_string::str_abi_cxx11_((secure_string *)local_38);
  sha256(&local_f0,str);
  util::secure_string::operator=
            ((secure_string *)
             password_buffer.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  util::secure_string::~secure_string((secure_string *)local_38);
  pWVar1 = this->world;
  util::secure_string::str_abi_cxx11_
            ((secure_string *)
             password_buffer.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  Database::Query(&local_110,&pWVar1->db,
                  "UPDATE `accounts` SET `password` = \'$\' WHERE username = \'$\'",uVar2,uVar3);
  Database_Result::~Database_Result(&local_110);
  return;
}

Assistant:

void Player::ChangePass(util::secure_string&& password)
{
	{
		util::secure_string password_buffer(std::move(std::string(this->world->config["PasswordSalt"]) + this->username + password.str()));
		password = sha256(password_buffer.str());
	}

	this->world->db.Query("UPDATE `accounts` SET `password` = '$' WHERE username = '$'", password.str().c_str(), this->username.c_str());
}